

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FragmentStamp.cpp
# Opt level: O3

void __thiscall OpenMD::FragmentStamp::checkTorsions(FragmentStamp *this)

{
  _Tuple_impl<2UL,_int,_int> _Var1;
  int iVar2;
  pointer piVar3;
  long lVar4;
  pointer pcVar5;
  _Tuple_impl<2UL,_int,_int> _Var6;
  bool bVar7;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var9;
  _Alloc_hider _Var10;
  pointer ppTVar11;
  iterator iVar12;
  ostream *poVar13;
  OpenMDException *pOVar14;
  int __tmp;
  pointer ppTVar15;
  vector<int,_std::allocator<int>_> *cont;
  vector<int,_std::allocator<int>_> *cont_00;
  vector<int,_std::allocator<int>_> *cont_01;
  vector<int,_std::allocator<int>_> *cont_02;
  ulong uVar16;
  long lVar17;
  int ghostIndex;
  set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
  allTorsions;
  vector<int,_std::allocator<int>_> torsionAtoms;
  vector<int,_std::allocator<int>_> rigidSet;
  ostringstream oss;
  string local_240;
  undefined1 local_220 [32];
  _Base_ptr local_200;
  size_t local_1f8;
  string local_1f0;
  vector<int,_std::allocator<int>_> local_1d0;
  undefined1 local_1b8 [12];
  _Head_base<2UL,_int,_false> _Stack_1ac;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  ppTVar11 = (this->torsionStamps_).
             super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppTVar15 = (this->torsionStamps_).
             super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (ppTVar15 != ppTVar11) {
    lVar17 = 0;
    uVar16 = 0;
    do {
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_1f0,
                 (vector<int,_std::allocator<int>_> *)
                 (*(long *)((long)ppTVar11 + (lVar17 >> 0x1d)) + 0x98));
      local_220._8_8_ =
           ((long)(this->atomStamps_).
                  super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->atomStamps_).
                  super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3) - 1;
      _Var8 = std::
              __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_pred<std::_Bind<std::greater<int>(std::_Placeholder<1>,unsigned_long)>>>
                        (local_1f0._M_dataplus._M_p,local_1f0._M_string_length,local_220);
      local_220._0_8_ = (pointer)0x0;
      _Var9 = std::
              __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_pred<std::_Bind<std::less<int>(std::_Placeholder<1>,int)>>>
                        (local_1f0._M_dataplus._M_p,local_1f0._M_string_length,local_220);
      if ((_Var8._M_current != (int *)local_1f0._M_string_length) ||
         (_Var9._M_current != (int *)local_1f0._M_string_length)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Error in Fragment ",0x12);
        pcVar5 = (this->Name).data_._M_dataplus._M_p;
        local_220._0_8_ = local_220 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_220,pcVar5,pcVar5 + (this->Name).data_._M_string_length);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(char *)local_220._0_8_,local_220._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,": atoms of torsion",0x12);
        containerToString<std::vector<int,std::allocator<int>>>
                  (&local_240,(OpenMD *)&local_1f0,cont_00);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar13,local_240._M_dataplus._M_p,local_240._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13," have invalid indices\n",0x16);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_dataplus._M_p != &local_240.field_2) {
          operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_220._0_8_ != local_220 + 0x10) {
          operator_delete((void *)local_220._0_8_,(ulong)(local_220._16_8_ + 1));
        }
        pOVar14 = (OpenMDException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        OpenMDException::OpenMDException(pOVar14,(string *)local_220);
        __cxa_throw(pOVar14,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
      bVar7 = hasDuplicateElement<std::vector<int,std::allocator<int>>>
                        ((vector<int,_std::allocator<int>_> *)&local_1f0);
      if (bVar7) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Error in Fragment ",0x12);
        pcVar5 = (this->Name).data_._M_dataplus._M_p;
        local_220._0_8_ = local_220 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_220,pcVar5,pcVar5 + (this->Name).data_._M_string_length);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(char *)local_220._0_8_,local_220._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13," : atoms of torsion",0x13);
        containerToString<std::vector<int,std::allocator<int>>>
                  (&local_240,(OpenMD *)&local_1f0,cont_01);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar13,local_240._M_dataplus._M_p,local_240._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar13," have duplicated indices\n",0x19);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_dataplus._M_p != &local_240.field_2) {
          operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_220._0_8_ != local_220 + 0x10) {
          operator_delete((void *)local_220._0_8_,(ulong)(local_220._16_8_ + 1));
        }
        pOVar14 = (OpenMDException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        OpenMDException::OpenMDException(pOVar14,(string *)local_220);
        __cxa_throw(pOVar14,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
      if ((int *)local_1f0._M_dataplus._M_p != (int *)0x0) {
        operator_delete(local_1f0._M_dataplus._M_p,
                        local_1f0.field_2._M_allocated_capacity - (long)local_1f0._M_dataplus._M_p);
      }
      uVar16 = uVar16 + 1;
      ppTVar11 = (this->torsionStamps_).
                 super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppTVar15 = (this->torsionStamps_).
                 super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      lVar17 = lVar17 + 0x100000000;
    } while (uVar16 < (ulong)((long)ppTVar15 - (long)ppTVar11 >> 3));
  }
  if (ppTVar15 == ppTVar11) {
    local_220._24_8_ = local_220 + 8;
    local_220._8_8_ = local_220._8_8_ & 0xffffffff00000000;
    local_220._16_8_ = (_Base_ptr)0x0;
    local_1f8 = 0;
    local_200 = (_Base_ptr)local_220._24_8_;
  }
  else {
    uVar16 = 0;
    do {
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_1f0,&ppTVar11[(int)uVar16]->members_);
      local_220._0_8_ = local_220._0_8_ & 0xffffffff00000000;
      std::vector<int,_std::allocator<int>_>::vector
                (&local_1d0,
                 (long)(this->rigidBodyStamps_).
                       super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->rigidBodyStamps_).
                       super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3,
                 (value_type_conflict1 *)local_220,(allocator_type *)&local_240);
      if (local_1f0._M_dataplus._M_p != (pointer)local_1f0._M_string_length) {
        piVar3 = (this->atom2Rigidbody).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        _Var10._M_p = local_1f0._M_dataplus._M_p;
        do {
          lVar17 = (long)piVar3[*(int *)_Var10._M_p];
          if ((-1 < lVar17) &&
             (iVar2 = ((_Tuple_impl<3UL,_int> *)
                      local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start)[lVar17].super__Head_base<3UL,_int,_false>.
                      _M_head_impl,
             ((_Tuple_impl<3UL,_int> *)
             local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start)[lVar17].super__Head_base<3UL,_int,_false>._M_head_impl = iVar2 + 1,
             2 < iVar2)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Error in Fragment ",0x12);
            pcVar5 = (this->Name).data_._M_dataplus._M_p;
            local_220._0_8_ = local_220 + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_220,pcVar5,pcVar5 + (this->Name).data_._M_string_length);
            poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,(char *)local_220._0_8_,local_220._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar13,": torsion",9);
            containerToString<std::vector<int,std::allocator<int>>>
                      (&local_240,(OpenMD *)&local_1f0,cont);
            poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar13,local_240._M_dataplus._M_p,local_240._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar13,"has four atoms on the same rigid body\n",0x26);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_240._M_dataplus._M_p != &local_240.field_2) {
              operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1
                             );
            }
            if ((undefined1 *)local_220._0_8_ != local_220 + 0x10) {
              operator_delete((void *)local_220._0_8_,(ulong)(local_220._16_8_ + 1));
            }
            pOVar14 = (OpenMDException *)__cxa_allocate_exception(0x28);
            std::__cxx11::stringbuf::str();
            OpenMDException::OpenMDException(pOVar14,(string *)local_220);
            __cxa_throw(pOVar14,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
          }
          _Var10._M_p = _Var10._M_p + 4;
        } while (_Var10._M_p != (pointer)local_1f0._M_string_length);
      }
      if ((_Tuple_impl<2UL,_int,_int> *)
          local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (_Tuple_impl<2UL,_int,_int> *)0x0) {
        operator_delete(local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((int *)local_1f0._M_dataplus._M_p != (int *)0x0) {
        operator_delete(local_1f0._M_dataplus._M_p,
                        local_1f0.field_2._M_allocated_capacity - (long)local_1f0._M_dataplus._M_p);
      }
      uVar16 = uVar16 + 1;
      ppTVar11 = (this->torsionStamps_).
                 super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppTVar15 = (this->torsionStamps_).
                 super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    } while (uVar16 < (ulong)((long)ppTVar15 - (long)ppTVar11 >> 3));
    local_220._24_8_ = local_220 + 8;
    local_220._8_8_ = local_220._8_8_ & 0xffffffff00000000;
    local_220._16_8_ = (_Base_ptr)0x0;
    local_1f8 = 0;
    local_200 = (_Base_ptr)local_220._24_8_;
    if (ppTVar15 != ppTVar11) {
      lVar17 = 0;
      uVar16 = 0;
      do {
        lVar4 = *(long *)((long)ppTVar11 + (lVar17 >> 0x1d));
        std::vector<int,_std::allocator<int>_>::vector
                  (&local_1d0,(vector<int,_std::allocator<int>_> *)(lVar4 + 0x98));
        if ((long)local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start == 0xc) {
          local_240._M_dataplus._M_p._0_4_ = *(undefined4 *)(lVar4 + 0x94);
          _Var8 = std::
                  __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                            (local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start,
                             local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish,&local_240);
          if (_Var8._M_current !=
              local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            std::vector<int,_std::allocator<int>_>::insert
                      (&local_1d0,(const_iterator)_Var8._M_current,
                       (value_type_conflict1 *)&local_240);
          }
        }
        _Var1 = *(_Tuple_impl<2UL,_int,_int> *)
                 ((long)local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start + 8);
        local_1b8._4_4_ =
             (int)_Var1.super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl;
        local_1b8._0_4_ =
             (_Head_base<3UL,_int,_false>)
             (_Head_base<3UL,_int,_false>)
             _Var1.super__Head_base<2UL,_int,_false>._M_head_impl._M_head_impl;
        _Stack_1ac._M_head_impl =
             (((_Tuple_impl<3UL,_int> *)
              local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start)->super__Head_base<3UL,_int,_false>)._M_head_impl;
        _Var6.super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl =
             (_Head_base<3UL,_int,_false>)
             local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start[0];
        _Var6.super__Head_base<2UL,_int,_false>._M_head_impl =
             local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start[1];
        local_1b8._8_4_ =
             ((_Head_base<2UL,_int,_false> *)
             ((long)local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start + 4))->_M_head_impl;
        if (_Var1.super__Head_base<2UL,_int,_false>._M_head_impl._M_head_impl <
            _Stack_1ac._M_head_impl) {
          local_1b8._0_8_ = _Var6;
          unique0x10000ec7 = _Var1;
        }
        iVar12 = std::
                 _Rb_tree<std::tuple<int,_int,_int,_int>,_std::tuple<int,_int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int,_int>_>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                 ::find((_Rb_tree<std::tuple<int,_int,_int,_int>,_std::tuple<int,_int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int,_int>_>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                         *)local_220,(key_type *)local_1b8);
        if (iVar12._M_node != (_Base_ptr)(local_220 + 8)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Error in Fragment ",0x12);
          pcVar5 = (this->Name).data_._M_dataplus._M_p;
          local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_240,pcVar5,pcVar5 + (this->Name).data_._M_string_length);
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,local_240._M_dataplus._M_p,
                               local_240._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,": ",2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,"Torsion",7);
          containerToString<std::vector<int,std::allocator<int>>>
                    (&local_1f0,(OpenMD *)&local_1d0,cont_02);
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar13,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar13," appears multiple times\n",0x18);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_240._M_dataplus._M_p != &local_240.field_2) {
            operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
          }
          pOVar14 = (OpenMDException *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          OpenMDException::OpenMDException(pOVar14,&local_240);
          __cxa_throw(pOVar14,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
        }
        std::
        _Rb_tree<std::tuple<int,int,int,int>,std::tuple<int,int,int,int>,std::_Identity<std::tuple<int,int,int,int>>,std::less<std::tuple<int,int,int,int>>,std::allocator<std::tuple<int,int,int,int>>>
        ::_M_insert_unique<std::tuple<int,int,int,int>const&>
                  ((_Rb_tree<std::tuple<int,int,int,int>,std::tuple<int,int,int,int>,std::_Identity<std::tuple<int,int,int,int>>,std::less<std::tuple<int,int,int,int>>,std::allocator<std::tuple<int,int,int,int>>>
                    *)local_220,(key_type *)local_1b8);
        if ((_Tuple_impl<2UL,_int,_int> *)
            local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (_Tuple_impl<2UL,_int,_int> *)0x0) {
          operator_delete(local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        uVar16 = uVar16 + 1;
        ppTVar11 = (this->torsionStamps_).
                   super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        lVar17 = lVar17 + 0x100000000;
      } while (uVar16 < (ulong)((long)(this->torsionStamps_).
                                      super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar11 >>
                               3));
    }
  }
  std::
  _Rb_tree<std::tuple<int,_int,_int,_int>,_std::tuple<int,_int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int,_int>_>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::tuple<int,_int,_int,_int>,_std::tuple<int,_int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int,_int>_>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
               *)local_220);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void FragmentStamp::checkTorsions() {
    std::ostringstream oss;
    for (std::size_t i = 0; i < getNTorsions(); ++i) {
      TorsionStamp* torsionStamp    = getTorsionStamp(i);
      std::vector<int> torsionAtoms = torsionStamp->getMembers();
      std::vector<int>::iterator j  = std::find_if(
          torsionAtoms.begin(), torsionAtoms.end(),
          std::bind(std::greater<int>(), placeholders::_1, getNAtoms() - 1));
      std::vector<int>::iterator k =
          std::find_if(torsionAtoms.begin(), torsionAtoms.end(),
                       std::bind(std::less<int>(), placeholders::_1, 0));

      if (j != torsionAtoms.end() || k != torsionAtoms.end()) {
        oss << "Error in Fragment " << getName() << ": atoms of torsion"
            << containerToString(torsionAtoms) << " have invalid indices\n";
        throw OpenMDException(oss.str());
      }
      if (hasDuplicateElement(torsionAtoms)) {
        oss << "Error in Fragment " << getName() << " : atoms of torsion"
            << containerToString(torsionAtoms) << " have duplicated indices\n";
        throw OpenMDException(oss.str());
      }
    }

    for (std::size_t i = 0; i < getNTorsions(); ++i) {
      TorsionStamp* torsionStamp    = getTorsionStamp(i);
      std::vector<int> torsionAtoms = torsionStamp->getMembers();
      std::vector<int> rigidSet(getNRigidBodies(), 0);
      std::vector<int>::iterator j;
      for (j = torsionAtoms.begin(); j != torsionAtoms.end(); ++j) {
        int rigidbodyIndex = atom2Rigidbody[*j];
        if (rigidbodyIndex >= 0) {
          ++rigidSet[rigidbodyIndex];
          if (rigidSet[rigidbodyIndex] > 3) {
            oss << "Error in Fragment " << getName() << ": torsion"
                << containerToString(torsionAtoms)
                << "has four atoms on the same rigid body\n";
            throw OpenMDException(oss.str());
          }
        }
      }
    }

    std::set<std::tuple<int, int, int, int>> allTorsions;
    std::set<std::tuple<int, int, int, int>>::iterator iter;
    for (std::size_t i = 0; i < getNTorsions(); ++i) {
      TorsionStamp* torsionStamp = getTorsionStamp(i);
      std::vector<int> torsion   = torsionStamp->getMembers();
      if (torsion.size() == 3) {
        int ghostIndex = torsionStamp->getGhostVectorSource();
        std::vector<int>::iterator j =
            std::find(torsion.begin(), torsion.end(), ghostIndex);
        if (j != torsion.end()) { torsion.insert(j, ghostIndex); }
      }

      std::tuple<int, int, int, int> torsionTuple(torsion[0], torsion[1],
                                                  torsion[2], torsion[3]);
      auto& [first, second, third, fourth] = torsionTuple;

      if (first > fourth) {
        std::swap(first, fourth);
        std::swap(second, third);
      }

      iter = allTorsions.find(torsionTuple);
      if (iter == allTorsions.end()) {
        allTorsions.insert(torsionTuple);
      } else {
        oss << "Error in Fragment " << getName() << ": "
            << "Torsion" << containerToString(torsion)
            << " appears multiple times\n";
        throw OpenMDException(oss.str());
      }
    }
  }